

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleAverageVerifier::logInfo
          (SampleAverageVerifier *this,TestLog *log)

{
  MessageBuilder *pMVar1;
  MessageBuilder local_198;
  TestLog *local_18;
  TestLog *log_local;
  SampleAverageVerifier *this_local;
  
  local_18 = log;
  log_local = (TestLog *)this;
  tcu::TestLog::operator<<(&local_198,log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<
                     (&local_198,
                      (char (*) [90])
                      "Expecting average sample position to be near the pixel center. Maximum per-axis distance "
                     );
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&this->m_distanceThreshold);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  return;
}

Assistant:

void SampleAverageVerifier::logInfo (tcu::TestLog& log) const
{
	log << tcu::TestLog::Message << "Expecting average sample position to be near the pixel center. Maximum per-axis distance " << m_distanceThreshold << tcu::TestLog::EndMessage;
}